

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O3

void test_all_maps<HashObject<16,16>>(int obj_size,int iters)

{
  float fVar1;
  int iVar2;
  pointer psVar3;
  iterator iVar4;
  nonempty_iterator ppVar5;
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  *psVar6;
  long lVar7;
  long lVar8;
  value_type *pvVar9;
  iterator iVar10;
  value_type *pvVar11;
  pointer ppVar12;
  uint *puVar13;
  iterator iVar14;
  __node_base _Var15;
  _Base_ptr p_Var16;
  int iVar17;
  iterator iVar18;
  pointer ppVar19;
  pointer end_memory;
  pointer end_memory_00;
  size_t end_memory_01;
  size_t start_memory;
  size_t start_memory_00;
  pointer ppVar20;
  size_t start_memory_01;
  size_t start_memory_02;
  size_t start_memory_03;
  size_t start_memory_04;
  size_t start_memory_05;
  size_t start_memory_06;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  size_type req_elements;
  _Base_ptr p_Var24;
  _Base_ptr p_Var25;
  _Base_ptr p_Var26;
  _Base_ptr p_Var27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_HashObject<16,_16>,_int>_>,_std::_Rb_tree_iterator<std::pair<const_HashObject<16,_16>,_int>_>_>
  pVar46;
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> set;
  undefined1 local_140 [16];
  __node_base local_130;
  _Base_ptr p_Stack_128;
  _Base_ptr local_120;
  size_t local_118;
  __node_base_ptr p_Stack_110;
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  local_108;
  size_type local_f0;
  pointer local_e0;
  undefined1 local_d8 [8];
  char acStack_d0 [4];
  char acStack_cc [4];
  iterator local_c8;
  iterator iStack_c0;
  pointer local_b8;
  iterator iStack_b0;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  nonempty_iterator local_98;
  ulong local_90;
  sparse_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  local_88;
  HashObject<16,_16> local_40;
  
  end_memory_00 = (pointer)(ulong)(uint)obj_size;
  iVar18._M_current =
       (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
        *)end_memory_00;
  printf("\n%s (%d byte objects, %d iterations):\n","SPARSE_HASH_MAP",0x10);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar22 = 0;
    do {
      lVar8 = (uVar22 & 0xff) * 0x101010101010101;
      iVar18._M_current =
           (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)(local_d8 + 4);
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = (uint)uVar22;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)local_140,(key_type *)local_d8);
      uVar23 = (uint)uVar22 + 1;
      uVar22 = (ulong)uVar23;
      pvVar9->second = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)iVar18._M_current
        );
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_108);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  req_elements = (size_type)obj_size;
  google::
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::resize((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)local_140,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      iVar18._M_current =
           (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)(local_d8 + 4);
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar9->second = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,
         (size_t)iVar18._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_108);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar9->second = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      iVar18._M_current =
           (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar9->second = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,
         (size_t)iVar18._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_108);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  auVar45 = _DAT_0013b020;
  uVar22 = (ulong)(uint)obj_size;
  if (0 < obj_size) {
    iVar18._M_current =
         (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = uVar22 - 1;
    auVar29._8_4_ = (int)lVar7;
    auVar29._0_8_ = lVar7;
    auVar29._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar19 = (pointer)0x0;
    auVar29 = auVar29 ^ _DAT_0013b020;
    auVar44 = _DAT_0013b010;
    do {
      auVar43 = auVar44 ^ auVar45;
      if ((bool)(~(auVar29._4_4_ < auVar43._4_4_ ||
                  auVar29._0_4_ < auVar43._0_4_ && auVar43._4_4_ == auVar29._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4) = (int)ppVar19;
      }
      if (auVar43._12_4_ <= auVar29._12_4_ &&
          (auVar43._8_4_ <= auVar29._8_4_ || auVar43._12_4_ != auVar29._12_4_)) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4 + 4) = (int)ppVar19 + 1;
      }
      ppVar19 = (pointer)((long)&(ppVar19->first).i_ + 2);
      lVar7 = auVar44._8_8_;
      auVar44._0_8_ = auVar44._0_8_ + 2;
      auVar44._8_8_ = lVar7 + 2;
    } while ((pointer)iVar18._M_current != ppVar19);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_140);
  time_map_fetch<EasyUseSparseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_random");
  if ((__buckets_ptr)local_140._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    iVar18._M_current =
         (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
          *)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = uVar22 - 1;
    auVar30._8_4_ = (int)lVar7;
    auVar30._0_8_ = lVar7;
    auVar30._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar19 = (pointer)0x0;
    auVar30 = auVar30 ^ _DAT_0013b020;
    auVar43 = _DAT_0013b010;
    do {
      auVar44 = auVar43 ^ auVar45;
      if ((bool)(~(auVar30._4_4_ < auVar44._4_4_ ||
                  auVar30._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar30._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4) = (int)ppVar19;
      }
      if (auVar44._12_4_ <= auVar30._12_4_ &&
          (auVar44._8_4_ <= auVar30._8_4_ || auVar44._12_4_ != auVar30._12_4_)) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4 + 4) = (int)ppVar19 + 1;
      }
      ppVar19 = (pointer)((long)&(ppVar19->first).i_ + 2);
      lVar7 = auVar43._8_8_;
      auVar43._0_8_ = auVar43._0_8_ + 2;
      auVar43._8_8_ = lVar7 + 2;
    } while ((pointer)iVar18._M_current != ppVar19);
  }
  time_map_fetch<EasyUseSparseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_sequential");
  if ((__buckets_ptr)local_140._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  local_90 = uVar22;
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar23 = 1;
  }
  else {
    uVar23 = 1;
    uVar22 = 0;
    do {
      local_40.buffer_._0_8_ = (uVar22 & 0xff) * 0x101010101010101;
      local_40.buffer_._8_4_ = SUB84(local_40.buffer_._0_8_,0);
      local_40.i_ = (int)uVar22;
      google::
      sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
      ::find<HashObject<16,16>>
                ((iterator *)local_d8,
                 (sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                  *)local_140,&local_40);
      local_88.pos.row_begin._M_current._0_4_ =
           SUB84(local_108.
                 super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,0);
      local_88.pos.row_begin._M_current._4_4_ =
           (undefined4)
           ((ulong)local_108.
                   super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 0x20);
      local_88.pos.row_end._M_current =
           local_108.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.pos.row_current._M_current =
           local_108.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.pos.col_current = (pointer)0x0;
      local_88.end.row_begin._M_current =
           local_108.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_88.end.row_end._M_current =
           local_108.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.end.row_current._M_current =
           local_108.
           super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_88.end.col_current = (nonempty_iterator)0x0;
      local_88.ht = (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                     *)local_140;
      google::
      sparse_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::advance_past_deleted(&local_88);
      uVar21 = 1;
      iVar18._M_current =
           (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)CONCAT44(acStack_cc,acStack_d0);
      if ((((pointer)CONCAT44(acStack_cc,acStack_d0) ==
            (pointer)CONCAT44(local_88.pos.row_begin._M_current._4_4_,
                              local_88.pos.row_begin._M_current._0_4_)) &&
          (iVar18._M_current = local_c8._M_current,
          local_c8._M_current == local_88.pos.row_end._M_current)) &&
         (iStack_c0._M_current == local_88.pos.row_current._M_current)) {
        if (iStack_c0._M_current == local_c8._M_current) {
          uVar21 = 0;
        }
        else {
          uVar21 = (uint)(local_b8 != local_88.pos.col_current);
          iVar18._M_current =
               (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                *)local_b8;
        }
      }
      uVar23 = uVar23 ^ uVar21;
      uVar21 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar21;
    } while (obj_size != uVar21);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar23);
  report("map_fetch_empty",(double)(lVar8 - lVar7),obj_size,start_memory,(size_t)iVar18._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_108);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar9->second = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      iVar18._M_current =
           (sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)0x101010101010101;
      lVar8 = ((ulong)uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      google::
      sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,
         (size_t)iVar18._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_108);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)local_140,(key_type *)local_d8);
      uVar21 = uVar23 + 1;
      pvVar9->second = uVar21;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      local_d8._0_4_ = uVar23;
      acStack_cc = (char  [4])local_d8._4_4_;
      google::
      sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140,(key_type *)local_d8);
      uVar23 = uVar21;
    } while (uVar21 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,
         (size_t)iVar18._M_current);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_108);
  EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseSparseHashMap
            ((EasyUseSparseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar9 = google::
               sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
               ::
               find_or_insert<google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::DefaultValue>
                         ((sparse_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::sparse_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                           *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar9->second = uVar23;
    } while (obj_size != uVar23);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar8 = std::chrono::_V2::steady_clock::now();
  google::
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::begin(&local_88,
          (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
           *)local_140);
  acStack_d0[0] = (char)local_88.pos.row_begin._M_current;
  acStack_d0[1] = local_88.pos.row_begin._M_current._1_1_;
  acStack_d0[2] = local_88.pos.row_begin._M_current._2_1_;
  acStack_d0[3] = local_88.pos.row_begin._M_current._3_1_;
  acStack_cc[0] = local_88.pos.row_begin._M_current._4_1_;
  acStack_cc[1] = local_88.pos.row_begin._M_current._5_1_;
  acStack_cc[2] = local_88.pos.row_begin._M_current._6_1_;
  acStack_cc[3] = local_88.pos.row_begin._M_current._7_1_;
  local_c8._M_current = local_88.pos.row_end._M_current;
  iStack_c0._M_current = local_88.pos.row_current._M_current;
  local_b8 = local_88.pos.col_current;
  iStack_b0._M_current = local_88.end.row_begin._M_current;
  local_a8 = local_88.end.row_end._M_current._0_4_;
  uStack_a4 = local_88.end.row_end._M_current._4_4_;
  uStack_a0 = local_88.end.row_current._M_current._0_4_;
  uStack_9c = local_88.end.row_current._M_current._4_4_;
  local_98 = local_88.end.col_current;
  local_88.pos.row_begin._M_current._0_4_ =
       SUB84(local_108.
             super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,0);
  local_88.pos.row_begin._M_current._4_4_ =
       (undefined4)
       ((ulong)local_108.
               super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 0x20);
  local_88.pos.row_end._M_current =
       local_108.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.pos.row_current._M_current =
       local_108.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.pos.col_current = (pointer)0x0;
  local_88.end.row_begin._M_current =
       local_108.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.end.row_end._M_current =
       local_108.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.end.row_current._M_current =
       local_108.
       super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_88.end.col_current = (nonempty_iterator)0x0;
  psVar6 = (sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)local_140;
  local_d8 = (undefined1  [8])local_88.ht;
  google::
  sparse_hashtable_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::advance_past_deleted(&local_88);
  local_88.ht = psVar6;
  ppVar5 = local_88.pos.col_current;
  iVar4._M_current = local_88.pos.row_current._M_current;
  iVar18._M_current = local_88.pos.row_end._M_current;
  lVar7 = CONCAT44(local_88.pos.row_begin._M_current._4_4_,local_88.pos.row_begin._M_current._0_4_);
  uVar23 = 1;
  do {
    if (CONCAT44(acStack_cc,acStack_d0) == lVar7) {
      if (((local_c8._M_current == iVar18._M_current) && (iStack_c0._M_current == iVar4._M_current))
         && (iVar4._M_current == iVar18._M_current || local_b8 == ppVar5)) break;
    }
    uVar23 = uVar23 ^ local_b8->second;
    local_b8 = local_b8 + 1;
    iVar10._M_current = iStack_c0._M_current;
    if (local_b8 ==
        (pointer)(*(long *)&(iStack_c0._M_current)->group +
                 (ulong)((uint)((iStack_c0._M_current)->settings).num_buckets * 0x14))) {
      do {
        iVar10._M_current = iStack_c0._M_current + 1;
        if (iVar10._M_current == local_c8._M_current) break;
        local_b8 = (iVar10._M_current)->group;
        psVar3 = iStack_c0._M_current + 1;
        iStack_c0._M_current = iVar10._M_current;
      } while ((psVar3->settings).num_buckets == 0);
    }
    iStack_c0._M_current = iVar10._M_current;
    google::
    sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
    ::advance_past_deleted
              ((sparse_hashtable_const_iterator<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                *)local_d8);
  } while( true );
  ppVar19 = local_b8;
  lVar7 = std::chrono::_V2::steady_clock::now();
  srand(uVar23);
  report("map_iterate",(double)(lVar7 - lVar8),obj_size,start_memory_00,(size_t)ppVar19);
  std::
  vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
  ::~vector(&local_108);
  uVar23 = 0;
  ppVar19 = end_memory_00;
  printf("\n%s (%d byte objects, %d iterations):\n","DENSE_HASH_MAP",0x10);
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    do {
      ppVar19 = (pointer)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar11 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_140,(HashObject<16,_16> *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar11->second = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  if (local_e0 != (pointer)0x0) {
    free(local_e0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  google::
  dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::resize((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
            *)local_140,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      ppVar19 = (pointer)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar11 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_140,(HashObject<16,_16> *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar11->second = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  if (local_e0 != (pointer)0x0) {
    free(local_e0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  uVar23 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar11 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_140,(HashObject<16,_16> *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar11->second = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      ppVar19 = (pointer)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar11 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_140,(HashObject<16,_16> *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar11->second = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  uVar22 = local_90;
  if (local_e0 != (pointer)0x0) {
    free(local_e0);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    ppVar19 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = uVar22 - 1;
    auVar31._8_4_ = (int)lVar7;
    auVar31._0_8_ = lVar7;
    auVar31._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar20 = (pointer)0x0;
    auVar31 = auVar31 ^ _DAT_0013b020;
    auVar37 = _DAT_0013b010;
    do {
      auVar44 = auVar37 ^ auVar45;
      if ((bool)(~(auVar31._4_4_ < auVar44._4_4_ ||
                  auVar31._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar31._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4) = (int)ppVar20;
      }
      if (auVar44._12_4_ <= auVar31._12_4_ &&
          (auVar44._8_4_ <= auVar31._8_4_ || auVar44._12_4_ != auVar31._12_4_)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4 + 4) = (int)ppVar20 + 1;
      }
      ppVar20 = (pointer)((long)&(ppVar20->first).i_ + 2);
      lVar7 = auVar37._8_8_;
      auVar37._0_8_ = auVar37._0_8_ + 2;
      auVar37._8_8_ = lVar7 + 2;
    } while (ppVar19 != ppVar20);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_140);
  time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_random");
  if ((__buckets_ptr)local_140._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    ppVar19 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = uVar22 - 1;
    auVar32._8_4_ = (int)lVar7;
    auVar32._0_8_ = lVar7;
    auVar32._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar20 = (pointer)0x0;
    auVar32 = auVar32 ^ _DAT_0013b020;
    auVar38 = _DAT_0013b010;
    do {
      auVar44 = auVar38 ^ auVar45;
      if ((bool)(~(auVar32._4_4_ < auVar44._4_4_ ||
                  auVar32._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar32._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4) = (int)ppVar20;
      }
      if (auVar44._12_4_ <= auVar32._12_4_ &&
          (auVar44._8_4_ <= auVar32._8_4_ || auVar44._12_4_ != auVar32._12_4_)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4 + 4) = (int)ppVar20 + 1;
      }
      ppVar20 = (pointer)((long)&(ppVar20->first).i_ + 2);
      lVar7 = auVar38._8_8_;
      auVar38._0_8_ = auVar38._0_8_ + 2;
      auVar38._8_8_ = lVar7 + 2;
    } while (ppVar19 != ppVar20);
  }
  time_map_fetch<EasyUseDenseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_sequential");
  if ((__buckets_ptr)local_140._0_8_ != (__buckets_ptr)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  uVar23 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar21 = 1;
  if (0 < obj_size) {
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_88.ht._4_4_ = (undefined4)lVar8;
      local_88.pos.row_begin._M_current._0_4_ = (undefined4)((ulong)lVar8 >> 0x20);
      local_88.pos.row_begin._M_current._4_4_ = local_88.ht._4_4_;
      local_88.ht._0_4_ = uVar23;
      google::
      dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
      ::find<HashObject<16,16>>
                ((iterator *)local_d8,
                 (dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                  *)local_140,(HashObject<16,_16> *)&local_88);
      bVar28 = (pointer)CONCAT44(acStack_cc,acStack_d0) != local_e0 + local_f0;
      ppVar19 = (pointer)(ulong)bVar28;
      uVar21 = uVar21 ^ bVar28;
      uVar23 = uVar23 + 1;
    } while (obj_size != uVar23);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar21);
  report("map_fetch_empty",(double)(lVar8 - lVar7),obj_size,start_memory_01,(size_t)ppVar19);
  if (local_e0 != (pointer)0x0) {
    free(local_e0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  uVar23 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar11 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_140,(HashObject<16,_16> *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar11->second = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      ppVar19 = (pointer)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      google::
      dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  if (local_e0 != (pointer)0x0) {
    free(local_e0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      ppVar19 = (pointer)(local_d8 + 4);
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar11 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_140,(HashObject<16,_16> *)local_d8);
      uVar21 = uVar23 + 1;
      pvVar11->second = uVar21;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      local_d8._0_4_ = uVar23;
      acStack_cc = (char  [4])local_d8._4_4_;
      google::
      dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::erase((dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140,(HashObject<16,_16> *)local_d8);
      uVar23 = uVar21;
    } while (uVar21 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  if (local_e0 != (pointer)0x0) {
    free(local_e0);
  }
  EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn>::EasyUseDenseHashMap
            ((EasyUseDenseHashMap<HashObject<16,_16>,_int,_HashFn> *)local_140);
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pvVar11 = google::
                dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                ::find_or_insert<int,HashObject<16,16>>
                          ((dense_hashtable<std::pair<HashObject<16,16>const,int>,HashObject<16,16>,HashFn,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SelectKey,google::dense_hash_map<HashObject<16,16>,int,HashFn,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>::SetKey,std::equal_to<HashObject<16,16>>,google::libc_allocator_with_realloc<std::pair<HashObject<16,16>const,int>>>
                            *)local_140,(HashObject<16,_16> *)local_d8);
      uVar23 = uVar23 + 1;
      pvVar11->second = uVar23;
    } while (obj_size != uVar23);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  ppVar12 = local_e0;
  if (local_f0 == 0) {
LAB_00121b47:
    end_memory = local_e0 + local_f0;
    if (ppVar12 != end_memory) {
      uVar23 = 1;
      do {
        uVar23 = uVar23 ^ ppVar12->second;
        do {
          ppVar12 = ppVar12 + 1;
          if (ppVar12 == end_memory) goto LAB_00121b99;
          fVar1 = (float)(ppVar12->first).i_;
        } while ((p_Stack_110._0_4_ == fVar1) ||
                (local_108.
                 super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0 &&
                 local_120._0_4_ == fVar1));
      } while (ppVar12 != end_memory);
      goto LAB_00121b99;
    }
  }
  else {
    lVar8 = local_f0 * 0x14;
    do {
      fVar1 = (float)(ppVar12->first).i_;
      if ((p_Stack_110._0_4_ != fVar1) &&
         (local_108.
          super__Vector_base<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0 || local_120._0_4_ != fVar1))
      goto LAB_00121b47;
      ppVar12 = ppVar12 + 1;
      lVar8 = lVar8 + -0x14;
      end_memory = local_e0;
    } while (lVar8 != 0);
  }
  uVar23 = 1;
LAB_00121b99:
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar23);
  report("map_iterate",(double)(lVar8 - lVar7),obj_size,start_memory_02,(size_t)end_memory);
  if (local_e0 != (pointer)0x0) {
    free(local_e0);
  }
  ppVar19 = end_memory_00;
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD HASH_MAP",0x10);
  local_140._0_8_ = &p_Stack_110;
  local_140._8_8_ = (pointer)0x1;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)CONCAT44(local_120._4_4_,1.0);
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      ppVar19 = (pointer)(local_d8 + 4);
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  local_140._0_8_ = &p_Stack_110;
  local_140._8_8_ = (pointer)0x1;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)CONCAT44(local_120._4_4_,1.0);
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::rehash((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)local_140,req_elements);
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      ppVar19 = (pointer)(local_d8 + 4);
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  local_140._0_8_ = &p_Stack_110;
  local_140._8_8_ = (pointer)0x1;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)CONCAT44(local_120._4_4_,1.0);
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      ppVar19 = (pointer)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  uVar22 = local_90;
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    ppVar19 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = local_90 - 1;
    auVar33._8_4_ = (int)lVar7;
    auVar33._0_8_ = lVar7;
    auVar33._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar20 = (pointer)0x0;
    auVar33 = auVar33 ^ _DAT_0013b020;
    auVar39 = _DAT_0013b010;
    do {
      auVar44 = auVar39 ^ auVar45;
      if ((bool)(~(auVar33._4_4_ < auVar44._4_4_ ||
                  auVar33._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar33._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4) = (int)ppVar20;
      }
      if (auVar44._12_4_ <= auVar33._12_4_ &&
          (auVar44._8_4_ <= auVar33._8_4_ || auVar44._12_4_ != auVar33._12_4_)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4 + 4) = (int)ppVar20 + 1;
      }
      ppVar20 = (pointer)((long)&(ppVar20->first).i_ + 2);
      lVar7 = auVar39._8_8_;
      auVar39._0_8_ = auVar39._0_8_ + 2;
      auVar39._8_8_ = lVar7 + 2;
    } while (ppVar19 != ppVar20);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_140);
  time_map_fetch<EasyUseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_random");
  if ((__node_base_ptr *)local_140._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    ppVar19 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = uVar22 - 1;
    auVar34._8_4_ = (int)lVar7;
    auVar34._0_8_ = lVar7;
    auVar34._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar20 = (pointer)0x0;
    auVar34 = auVar34 ^ _DAT_0013b020;
    auVar40 = _DAT_0013b010;
    do {
      auVar44 = auVar40 ^ auVar45;
      if ((bool)(~(auVar34._4_4_ < auVar44._4_4_ ||
                  auVar34._0_4_ < auVar44._0_4_ && auVar44._4_4_ == auVar34._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4) = (int)ppVar20;
      }
      if (auVar44._12_4_ <= auVar34._12_4_ &&
          (auVar44._8_4_ <= auVar34._8_4_ || auVar44._12_4_ != auVar34._12_4_)) {
        *(int *)(local_140._0_8_ + (long)ppVar20 * 4 + 4) = (int)ppVar20 + 1;
      }
      ppVar20 = (pointer)((long)&(ppVar20->first).i_ + 2);
      lVar7 = auVar40._8_8_;
      auVar40._0_8_ = auVar40._0_8_ + 2;
      auVar40._8_8_ = lVar7 + 2;
    } while (ppVar19 != ppVar20);
  }
  time_map_fetch<EasyUseHashMap<HashObject<16,16>,int,HashFn>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_sequential");
  if ((__node_base_ptr *)local_140._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  local_140._0_8_ = &p_Stack_110;
  local_140._8_8_ = (pointer)0x1;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)CONCAT44(local_120._4_4_,1.0);
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    uVar23 = 1;
  }
  else {
    uVar23 = 1;
    uVar21 = 0;
    do {
      lVar8 = (ulong)(uVar21 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar21;
      iVar14 = std::
               _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_140,(key_type *)local_d8);
      ppVar19 = (pointer)(ulong)(iVar14.
                                 super__Node_iterator_base<std::pair<const_HashObject<16,_16>,_int>,_true>
                                 ._M_cur != (__node_type *)0x0);
      uVar23 = uVar23 ^ iVar14.
                        super__Node_iterator_base<std::pair<const_HashObject<16,_16>,_int>,_true>.
                        _M_cur != (__node_type *)0x0;
      uVar21 = uVar21 + 1;
    } while (obj_size != uVar21);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar23);
  report("map_fetch_empty",(double)(lVar8 - lVar7),obj_size,start_memory_03,(size_t)ppVar19);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  local_140._0_8_ = &p_Stack_110;
  local_140._8_8_ = (pointer)0x1;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)CONCAT44(local_120._4_4_,1.0);
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      ppVar19 = (pointer)0x101010101010101;
      lVar8 = ((ulong)uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      std::
      _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_140,local_d8);
      uVar23 = uVar23 + 1;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  local_140._0_8_ = &p_Stack_110;
  local_140._8_8_ = (pointer)0x1;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)CONCAT44(local_120._4_4_,1.0);
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140,(key_type *)local_d8);
      uVar21 = uVar23 + 1;
      *puVar13 = uVar21;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      local_d8._0_4_ = uVar23;
      acStack_cc = (char  [4])local_d8._4_4_;
      std::
      _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_140,(key_type *)local_d8);
      uVar23 = uVar21;
    } while (uVar21 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)ppVar19);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  local_140._0_8_ = &p_Stack_110;
  local_140._8_8_ = (pointer)0x1;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)0x0;
  local_120 = (_Base_ptr)CONCAT44(local_120._4_4_,1.0);
  local_118 = 0;
  p_Stack_110 = (__node_base_ptr)0x0;
  g_num_copies = 0;
  g_num_hashes = 0;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      ppVar19 = (pointer)0x101010101010101;
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::__detail::
                        _Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar23 = 1;
  for (_Var15._M_nxt = local_130._M_nxt; _Var15._M_nxt != (_Hash_node_base *)0x0;
      _Var15._M_nxt = (_Var15._M_nxt)->_M_nxt) {
    uVar23 = uVar23 ^ *(uint *)&_Var15._M_nxt[3]._M_nxt;
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar23);
  report("map_iterate",(double)(lVar8 - lVar7),obj_size,start_memory_04,(size_t)ppVar19);
  std::
  _Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>,_std::__detail::_Select1st,_std::equal_to<HashObject<16,_16>_>,_HashFn,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_140);
  printf("\n%s (%d byte objects, %d iterations):\n","STANDARD MAP",0x10);
  p_Stack_128 = (_Base_ptr)(local_140 + 8);
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  local_118 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_120 = p_Stack_128;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar22 = 0;
    do {
      end_memory_00 = (pointer)0x101010101010101;
      lVar8 = (uVar22 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = (int)uVar22;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = (int)uVar22 + 1;
      uVar22 = (ulong)uVar23;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)end_memory_00);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140);
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)(local_140 + 8);
  local_118 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_120 = p_Stack_128;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      end_memory_00 = (pointer)(local_d8 + 4);
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_predict/grow",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,
         (size_t)end_memory_00);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140);
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)(local_140 + 8);
  local_118 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_120 = p_Stack_128;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      end_memory_00 = (pointer)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_replace",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)end_memory_00)
  ;
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  uVar22 = local_90;
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    end_memory_00 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = local_90 - 1;
    auVar35._8_4_ = (int)lVar7;
    auVar35._0_8_ = lVar7;
    auVar35._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar19 = (pointer)0x0;
    auVar35 = auVar35 ^ _DAT_0013b020;
    auVar41 = _DAT_0013b010;
    do {
      auVar44 = auVar41 ^ auVar45;
      if ((bool)(~(auVar44._4_4_ == auVar35._4_4_ && auVar35._0_4_ < auVar44._0_4_ ||
                  auVar35._4_4_ < auVar44._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4) = (int)ppVar19;
      }
      if ((auVar44._12_4_ != auVar35._12_4_ || auVar44._8_4_ <= auVar35._8_4_) &&
          auVar44._12_4_ <= auVar35._12_4_) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4 + 4) = (int)ppVar19 + 1;
      }
      ppVar19 = (pointer)((long)&(ppVar19->first).i_ + 2);
      lVar7 = auVar41._8_8_;
      auVar41._0_8_ = auVar41._0_8_ + 2;
      auVar41._8_8_ = lVar7 + 2;
    } while (end_memory_00 != ppVar19);
  }
  shuffle((vector<int,_std::allocator<int>_> *)local_140);
  time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_random");
  if ((__node_base_ptr *)local_140._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_140,req_elements,(allocator_type *)local_d8)
  ;
  auVar45 = _DAT_0013b020;
  if (0 < obj_size) {
    end_memory_00 = (pointer)(ulong)(obj_size + 1U & 0xfffffffe);
    lVar7 = uVar22 - 1;
    auVar36._8_4_ = (int)lVar7;
    auVar36._0_8_ = lVar7;
    auVar36._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppVar19 = (pointer)0x0;
    auVar36 = auVar36 ^ _DAT_0013b020;
    auVar42 = _DAT_0013b010;
    do {
      auVar44 = auVar42 ^ auVar45;
      if ((bool)(~(auVar44._4_4_ == auVar36._4_4_ && auVar36._0_4_ < auVar44._0_4_ ||
                  auVar36._4_4_ < auVar44._4_4_) & 1)) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4) = (int)ppVar19;
      }
      if ((auVar44._12_4_ != auVar36._12_4_ || auVar44._8_4_ <= auVar36._8_4_) &&
          auVar44._12_4_ <= auVar36._12_4_) {
        *(int *)(local_140._0_8_ + (long)ppVar19 * 4 + 4) = (int)ppVar19 + 1;
      }
      ppVar19 = (pointer)((long)&(ppVar19->first).i_ + 2);
      lVar7 = auVar42._8_8_;
      auVar42._0_8_ = auVar42._0_8_ + 2;
      auVar42._8_8_ = lVar7 + 2;
    } while (end_memory_00 != ppVar19);
  }
  time_map_fetch<EasyUseMap<HashObject<16,16>,int>>
            (obj_size,(vector<int,_std::allocator<int>_> *)local_140,"map_fetch_sequential");
  p_Var16 = (_Base_ptr)(local_140 + 8);
  if ((__node_base_ptr *)local_140._0_8_ != (__node_base_ptr *)0x0) {
    operator_delete((void *)local_140._0_8_);
  }
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  local_118 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  p_Stack_128 = p_Var16;
  local_120 = p_Var16;
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar23 = 1;
  if (0 < obj_size) {
    end_memory_00 = (pointer)0x0;
    do {
      iVar17 = (int)end_memory_00;
      p_Var26 = p_Var16;
      p_Var27 = p_Var16;
      _Var15._M_nxt = local_130._M_nxt;
      if (local_130._M_nxt != (_Hash_node_base *)0x0) {
        do {
          p_Var24 = (_Base_ptr)_Var15._M_nxt;
          p_Var25 = p_Var26;
          iVar2 = p_Var24[1]._M_color;
          p_Var26 = p_Var24;
          if (iVar2 < iVar17) {
            p_Var26 = p_Var25;
          }
          _Var15._M_nxt = (_Hash_node_base *)(&p_Var24->_M_left)[iVar2 < iVar17];
        } while ((&p_Var24->_M_left)[iVar2 < iVar17] != (_Base_ptr)0x0);
        if (p_Var26 != p_Var16) {
          if (iVar2 < iVar17) {
            p_Var24 = p_Var25;
          }
          p_Var27 = p_Var26;
          if (iVar17 < (int)p_Var24[1]._M_color) {
            p_Var27 = p_Var16;
          }
        }
      }
      uVar23 = uVar23 ^ p_Var27 != p_Var16;
      end_memory_00 = (pointer)(ulong)(iVar17 + 1U);
    } while (iVar17 + 1U != obj_size);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar23);
  report("map_fetch_empty",(double)(lVar8 - lVar7),obj_size,start_memory_05,(size_t)end_memory_00);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140);
  p_Stack_128 = (_Base_ptr)(local_140 + 8);
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  local_118 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_120 = p_Stack_128;
  std::chrono::_V2::steady_clock::now();
  if (obj_size < 1) {
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
  }
  else {
    uVar23 = 0;
    do {
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
    uVar23 = 0;
    g_num_copies = 0;
    g_num_hashes = 0;
    lVar7 = std::chrono::_V2::steady_clock::now();
    do {
      end_memory_00 = (pointer)0x101010101010101;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      pVar46 = std::
               _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                              *)local_140,(key_type *)local_d8);
      std::
      _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                      *)local_140,(_Base_ptr)pVar46.first._M_node,(_Base_ptr)pVar46.second._M_node);
      uVar23 = uVar23 + 1;
    } while (obj_size != uVar23);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_remove",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)end_memory_00);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140);
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  local_118 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  p_Stack_128 = (_Base_ptr)(local_140 + 8);
  local_120 = (_Base_ptr)(local_140 + 8);
  std::chrono::_V2::steady_clock::now();
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_140,(key_type *)local_d8);
      uVar21 = uVar23 + 1;
      *puVar13 = uVar21;
      lVar8 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar8;
      acStack_d0 = SUB84((ulong)lVar8 >> 0x20,0);
      local_d8._0_4_ = uVar23;
      acStack_cc = (char  [4])local_d8._4_4_;
      pVar46 = std::
               _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               ::equal_range((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                              *)local_140,(key_type *)local_d8);
      std::
      _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
      ::_M_erase_aux((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                      *)local_140,(_Base_ptr)pVar46.first._M_node,(_Base_ptr)pVar46.second._M_node);
      uVar23 = uVar21;
    } while (uVar21 != obj_size);
  }
  auVar45 = std::chrono::_V2::steady_clock::now();
  report("map_toggle",(double)(auVar45._0_8_ - lVar7),obj_size,auVar45._8_8_,(size_t)end_memory_00);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140);
  end_memory_01 = 0;
  local_140._8_8_ = local_140._8_8_ & 0xffffffff00000000;
  local_130._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_128 = (_Base_ptr)(local_140 + 8);
  local_118 = 0;
  g_num_copies = 0;
  g_num_hashes = 0;
  local_120 = p_Stack_128;
  std::chrono::_V2::steady_clock::now();
  if (0 < obj_size) {
    uVar23 = 0;
    do {
      end_memory_01 = 0x101010101010101;
      lVar7 = (ulong)(uVar23 & 0xff) * 0x101010101010101;
      local_d8._4_4_ = (undefined4)lVar7;
      acStack_d0 = SUB84((ulong)lVar7 >> 0x20,0);
      acStack_cc[0] = local_d8[4];
      acStack_cc[1] = local_d8[5];
      acStack_cc[2] = local_d8[6];
      acStack_cc[3] = local_d8[7];
      local_d8._0_4_ = uVar23;
      puVar13 = (uint *)std::
                        map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                        ::operator[]((map<HashObject<16,_16>,_int,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
                                      *)local_140,(key_type *)local_d8);
      uVar23 = uVar23 + 1;
      *puVar13 = uVar23;
    } while (obj_size != uVar23);
  }
  g_num_copies = 0;
  g_num_hashes = 0;
  lVar7 = std::chrono::_V2::steady_clock::now();
  uVar23 = 1;
  p_Var16 = p_Stack_128;
  while (p_Var16 != (_Rb_tree_node_base *)(local_140 + 8)) {
    uVar23 = uVar23 ^ *(uint *)&p_Var16[1]._M_left;
    p_Var16 = (_Base_ptr)std::_Rb_tree_increment(p_Var16);
  }
  lVar8 = std::chrono::_V2::steady_clock::now();
  srand(uVar23);
  report("map_iterate",(double)(lVar8 - lVar7),obj_size,start_memory_06,end_memory_01);
  std::
  _Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<HashObject<16,_16>,_std::pair<const_HashObject<16,_16>,_int>,_std::_Select1st<std::pair<const_HashObject<16,_16>,_int>_>,_std::less<HashObject<16,_16>_>,_std::allocator<std::pair<const_HashObject<16,_16>,_int>_>_>
               *)local_140);
  return;
}

Assistant:

static void test_all_maps(int obj_size, int iters) {
  const bool stress_hash_function = obj_size <= 8;

  if (FLAGS_test_sparse_hash_map)
    measure_map<EasyUseSparseHashMap<ObjType, int, HashFn>,
                EasyUseSparseHashMap<ObjType*, int, HashFn>>(
        "SPARSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_dense_hash_map)
    measure_map<EasyUseDenseHashMap<ObjType, int, HashFn>,
                EasyUseDenseHashMap<ObjType*, int, HashFn>>(
        "DENSE_HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_hash_map)
    measure_map<EasyUseHashMap<ObjType, int, HashFn>,
                EasyUseHashMap<ObjType*, int, HashFn>>(
        "STANDARD HASH_MAP", obj_size, iters, stress_hash_function);

  if (FLAGS_test_map)
    measure_map<EasyUseMap<ObjType, int>, EasyUseMap<ObjType*, int>>(
        "STANDARD MAP", obj_size, iters, false);
}